

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_hash.h
# Opt level: O0

uint64_t sylvan_tabhash16(uint64_t a,uint64_t b,uint64_t seed)

{
  int local_30;
  int local_2c;
  int i_1;
  int i;
  uint64_t *t;
  uint64_t seed_local;
  uint64_t b_local;
  uint64_t a_local;
  
  _i_1 = sylvan_tabhash_table;
  t = (uint64_t *)seed;
  b_local = a;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    t = (uint64_t *)(_i_1[b_local & 0xff] ^ (ulong)t);
    _i_1 = _i_1 + 0x100;
    b_local = b_local >> 8;
  }
  seed_local = b;
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    t = (uint64_t *)(_i_1[seed_local & 0xff] ^ (ulong)t);
    _i_1 = _i_1 + 0x100;
    seed_local = seed_local >> 8;
  }
  return (uint64_t)t;
}

Assistant:

static inline uint64_t
sylvan_tabhash16(uint64_t a, uint64_t b, uint64_t seed)
{
    uint64_t *t = sylvan_tabhash_table;
    for (int i=0; i<8; i++) {
        seed ^= t[(uint8_t)a];
        t += 256; // next table
        a >>= 8;
    }
    for (int i=0; i<8; i++) {
        seed ^= t[(uint8_t)b];
        t += 256; // next table
        b >>= 8;
    }
    return seed;
}